

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_percentile_tables.cpp
# Opt level: O2

bool is_legal_3d_block_size(uint xdim,uint ydim,uint zdim)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = ydim << 8 | xdim << 0x10 | zdim;
  bVar1 = true;
  if ((((1 < uVar2 - 0x40403) && (1 < uVar2 - 0x50504)) && (1 < uVar2 - 0x60605)) &&
     (((uVar2 != 0x30303 && (uVar2 != 0x40303)) && ((uVar2 != 0x50404 && (uVar2 != 0x60505)))))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_legal_3d_block_size(
	unsigned int xdim,
	unsigned int ydim,
	unsigned int zdim
) {
	unsigned int idx = (xdim << 16) | (ydim << 8) | zdim;
	switch (idx)
	{
		case 0x030303:
		case 0x040303:
		case 0x040403:
		case 0x040404:
		case 0x050404:
		case 0x050504:
		case 0x050505:
		case 0x060505:
		case 0x060605:
		case 0x060606:
			return true;
	}

	return false;
}